

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowMetricsWindow::Funcs::NodeDrawCmdShowMeshAndBoundingBox
               (ImGuiWindow *window,ImDrawList *draw_list,ImDrawCmd *draw_cmd,int elem_offset,
               bool show_mesh,bool show_aabb)

{
  ImDrawList *this;
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  ImVec2 IVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ImGuiContext *pIVar10;
  ImVec2 IVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  float fVar18;
  float fVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ImVec2 triangle [3];
  ImVec2 local_a8;
  ImVec2 local_98;
  ImVec2 local_88 [4];
  ImGuiContext *local_68;
  ImVec2 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pIVar10 = GImGui;
  if ((char)elem_offset == '\0' && !show_mesh) {
    __assert_fail("show_mesh || show_aabb",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x27df,
                  "static void ImGui::ShowMetricsWindow(bool *)::Funcs::NodeDrawCmdShowMeshAndBoundingBox(ImGuiWindow *, const ImDrawList *, const ImDrawCmd *, int, bool, bool)"
                 );
  }
  uVar9 = (ulong)draw_cmd & 0xffffffff;
  if ((int)(window->Pos).x < 1) {
    IVar11.x = 0.0;
    IVar11.y = 0.0;
  }
  else {
    IVar11 = window->Size;
  }
  this = &GImGui->ForegroundDrawList;
  uVar1 = *(undefined8 *)&(draw_list->CmdBuffer).Capacity;
  uVar2 = *(undefined8 *)((long)&(draw_list->CmdBuffer).Data + 4);
  uVar3 = (GImGui->ForegroundDrawList).Flags;
  (GImGui->ForegroundDrawList).Flags = uVar3 & 0xfffffffe;
  iVar7 = (draw_list->CmdBuffer).Size;
  uVar6 = (uint)draw_cmd;
  fVar14 = (float)uVar1;
  fVar13 = (float)((ulong)uVar1 >> 0x20);
  fVar15 = (float)uVar2;
  fVar18 = (float)((ulong)uVar2 >> 0x20);
  if (uVar6 < iVar7 + uVar6) {
    uStack_50 = 0;
    uStack_40 = 0;
    local_68 = pIVar10;
    auVar23 = _DAT_00199550;
    auVar24 = _DAT_00199420;
    local_58 = uVar1;
    local_48 = uVar2;
    do {
      local_88[0].x = 0.0;
      local_88[0].y = 0.0;
      local_88[1].x = 0.0;
      local_88[1].y = 0.0;
      local_88[2].x = 0.0;
      local_88[2].y = 0.0;
      fVar14 = (window->SizeFull).x;
      lVar8 = 0;
      fVar13 = auVar24._0_4_;
      fVar15 = auVar24._4_4_;
      uVar16 = auVar24._8_4_;
      uVar17 = auVar24._12_4_;
      fVar18 = auVar23._0_4_;
      fVar19 = auVar23._4_4_;
      uVar20 = auVar23._8_4_;
      uVar21 = auVar23._12_4_;
      do {
        iVar12 = (int)(uVar9 + lVar8);
        if (IVar11 != (ImVec2)0x0) {
          iVar12 = *(int *)((long)IVar11 + (uVar9 + lVar8 & 0xffffffff) * 4);
        }
        if ((int)fVar14 <= iVar12) {
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                        ,0x52f,
                        "const T &ImVector<ImDrawVert>::operator[](int) const [T = ImDrawVert]");
        }
        IVar4 = *(ImVec2 *)((long)window->ContentSize + (long)iVar12 * 0x14);
        auVar22._8_8_ = 0;
        auVar22._0_4_ = IVar4.x;
        auVar22._4_4_ = IVar4.y;
        local_88[lVar8] = IVar4;
        auVar23._4_4_ = fVar15;
        auVar23._0_4_ = fVar13;
        auVar23._8_4_ = uVar16;
        auVar23._12_4_ = uVar17;
        auVar24 = minps(auVar22,auVar23);
        auVar5._4_4_ = fVar19;
        auVar5._0_4_ = fVar18;
        auVar5._8_4_ = uVar20;
        auVar5._12_4_ = uVar21;
        auVar23 = maxps(auVar22,auVar5);
        lVar8 = lVar8 + 1;
        fVar13 = auVar24._0_4_;
        fVar15 = auVar24._4_4_;
        uVar16 = auVar24._8_4_;
        uVar17 = auVar24._12_4_;
        fVar18 = auVar23._0_4_;
        fVar19 = auVar23._4_4_;
        uVar20 = auVar23._8_4_;
        uVar21 = auVar23._12_4_;
      } while (lVar8 != 3);
      if ((char)elem_offset != '\0') {
        ImDrawList::AddPolyline(this,local_88,3,0xff00ffff,true,1.0);
        iVar7 = (draw_list->CmdBuffer).Size;
      }
      uVar9 = uVar9 + 3;
    } while ((uint)uVar9 < iVar7 + uVar6);
    local_98.y = (float)(int)fVar15;
    local_98.x = (float)(int)fVar13;
    local_a8.y = (float)(int)fVar19;
    local_a8.x = (float)(int)fVar18;
    pIVar10 = local_68;
    fVar14 = (float)local_58;
    fVar13 = local_58._4_4_;
    fVar15 = (float)local_48;
    fVar18 = local_48._4_4_;
  }
  if (show_mesh) {
    local_88[0].y = (float)(int)fVar13;
    local_88[0].x = (float)(int)fVar14;
    local_60.y = (float)(int)fVar18;
    local_60.x = (float)(int)fVar15;
    ImDrawList::AddRect(this,local_88,&local_60,0xffff00ff,0.0,0xf,1.0);
    local_88[0] = local_98;
    local_60 = local_a8;
    ImDrawList::AddRect(this,local_88,&local_60,0xffffff00,0.0,0xf,1.0);
  }
  (pIVar10->ForegroundDrawList).Flags = uVar3;
  return;
}

Assistant:

static void NodeDrawCmdShowMeshAndBoundingBox(ImGuiWindow* window, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, int elem_offset, bool show_mesh, bool show_aabb)
        {
            IM_ASSERT(show_mesh || show_aabb);
            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;

            // Draw wire-frame version of all triangles
            ImRect clip_rect = draw_cmd->ClipRect;
            ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
            ImDrawListFlags backup_flags = fg_draw_list->Flags;
            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
            for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + draw_cmd->ElemCount); base_idx += 3)
            {
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++)
                {
                    ImVec2 p = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    triangle[n] = p;
                    vtxs_rect.Add(p);
                }
                if (show_mesh)
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f); // In yellow: mesh triangles
            }
            // Draw bounding boxes
            if (show_aabb)
            {
                fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
                fg_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
            }
            fg_draw_list->Flags = backup_flags;
        }